

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadVertexData(ColladaParser *this,Mesh *pMesh)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string local_1b0;
  string local_190 [11];
  
  uVar2 = GetAttribute(this,"id");
  (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
  std::__cxx11::string::assign((char *)&pMesh->mVertexID);
  while( true ) {
    while( true ) {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar3 == '\0') {
        return;
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar3 == 1) break;
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar3 == 2) {
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"vertices");
        if (iVar3 == 0) {
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_190,"Expected end of <vertices> element.",
                   (allocator<char> *)&local_1b0);
        ThrowException(this,local_190);
      }
    }
    bVar1 = IsElement(this,"input");
    if (!bVar1) break;
    ReadInputChannel(this,&pMesh->mPerVertexData);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::operator<<((ostream *)local_190,"Unexpected sub element <");
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::operator<<((ostream *)local_190,(char *)CONCAT44(extraout_var_00,iVar3));
  std::operator<<((ostream *)local_190,"> in tag <vertices>");
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_1b0);
}

Assistant:

void ColladaParser::ReadVertexData(Mesh* pMesh)
{
    // extract the ID of the <vertices> element. Not that we care, but to catch strange referencing schemes we should warn about
    int attrID = GetAttribute("id");
    pMesh->mVertexID = mReader->getAttributeValue(attrID);

    // a number of <input> elements
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("input"))
            {
                ReadInputChannel(pMesh->mPerVertexData);
            }
            else
            {
                ThrowException(format() << "Unexpected sub element <" << mReader->getNodeName() << "> in tag <vertices>");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "vertices") != 0)
                ThrowException("Expected end of <vertices> element.");

            break;
        }
    }
}